

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

int __thiscall capnp::_::OrphanBuilder::truncate(OrphanBuilder *this,char *__file,__off_t __length)

{
  CapTableBuilder *capTable;
  uint uVar1;
  uint extraout_EAX;
  BuilderArena *arena;
  OrphanBuilder local_38;
  ElementSize local_15;
  uint local_14;
  ElementSize elementSize_local;
  OrphanBuilder *pOStack_10;
  ElementCount size_local;
  OrphanBuilder *this_local;
  
  local_15 = (ElementSize)__length;
  local_14 = (uint)__file;
  pOStack_10 = this;
  uVar1 = truncate(this,(char *)((ulong)__file & 0xffffffff),0);
  if ((uVar1 & 1) == 0) {
    arena = SegmentBuilder::getArena(this->segment);
    capTable = this->capTable;
    uVar1 = assumeBits<29u,unsigned_int>(local_14);
    initList(&local_38,arena,capTable,uVar1,local_15);
    operator=(this,&local_38);
    ~OrphanBuilder(&local_38);
    uVar1 = extraout_EAX;
  }
  return uVar1;
}

Assistant:

void OrphanBuilder::truncate(ElementCount size, ElementSize elementSize) {
  if (!truncate(size, false)) {
    // assumeBits() safe since it's checked inside truncate()
    *this = initList(segment->getArena(), capTable,
        assumeBits<LIST_ELEMENT_COUNT_BITS>(size), elementSize);
  }
}